

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceIntersector1MB>_>
::intersect(BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceIntersector1MB>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  Collider CVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 (*pauVar16) [16];
  AABBNodeMB4D *node1;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  RayQueryContext *prim;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1029;
  undefined1 local_1028 [16];
  ulong local_1010;
  Intersectors *local_1008;
  RayHit *local_1000;
  undefined1 (*local_ff8) [16];
  long local_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1000 = ray;
  if (*(long *)(*(long *)this + 0x70) != 8) {
    local_ff8 = (undefined1 (*) [16])local_f68;
    local_f78 = *(long *)(*(long *)this + 0x70);
    uStack_f70 = 0;
    fVar68 = *(float *)&This->ptr;
    fVar72 = *(float *)((long)&This->ptr + 4);
    fVar54 = *(float *)&This->leafIntersector;
    fVar34 = *(float *)((long)&This->leafIntersector + 4);
    CVar3 = This->collider;
    fVar58 = 0.0;
    if (0.0 <= fVar34) {
      fVar58 = fVar34;
    }
    fVar34 = *(float *)&(This->intersector1).intersect;
    auVar40 = ZEXT416((uint)fVar34);
    fVar37 = 0.0;
    if (0.0 <= fVar34) {
      fVar37 = fVar34;
    }
    auVar25._4_4_ = -(uint)(ABS(CVar3.collide._4_4_) < DAT_01f4bd50._4_4_);
    auVar25._0_4_ = -(uint)(ABS(CVar3.collide._0_4_) < (float)DAT_01f4bd50);
    auVar25._8_4_ = -(uint)(ABS(CVar3.name._0_4_) < DAT_01f4bd50._8_4_);
    auVar25._12_4_ = -(uint)(ABS(CVar3.name._4_4_) < DAT_01f4bd50._12_4_);
    auVar42 = blendvps((undefined1  [16])CVar3,_DAT_01f4bd50,auVar25);
    auVar25 = rcpps(auVar25,auVar42);
    fVar62 = auVar25._0_4_;
    fVar63 = auVar25._4_4_;
    fVar65 = auVar25._8_4_;
    fVar62 = (1.0 - auVar42._0_4_ * fVar62) * fVar62 + fVar62;
    fVar63 = (1.0 - auVar42._4_4_ * fVar63) * fVar63 + fVar63;
    fVar65 = (1.0 - auVar42._8_4_ * fVar65) * fVar65 + fVar65;
    uVar20 = (ulong)(fVar62 < 0.0) << 4;
    uVar22 = (ulong)(fVar63 < 0.0) << 4 | 0x20;
    uVar23 = (ulong)(fVar65 < 0.0) << 4 | 0x40;
    uVar19 = uVar20 ^ 0x10;
    local_1008 = This;
    local_f88 = fVar54;
    fStack_f84 = fVar54;
    fStack_f80 = fVar54;
    fStack_f7c = fVar54;
    local_f98 = fVar58;
    fStack_f94 = fVar58;
    fStack_f90 = fVar58;
    fStack_f8c = fVar58;
    local_fa8 = fVar65;
    fStack_fa4 = fVar65;
    fStack_fa0 = fVar65;
    fStack_f9c = fVar65;
    local_fb8 = fVar68;
    fStack_fb4 = fVar68;
    fStack_fb0 = fVar68;
    fStack_fac = fVar68;
    local_fc8 = fVar72;
    fStack_fc4 = fVar72;
    fStack_fc0 = fVar72;
    fStack_fbc = fVar72;
    local_1010 = uVar20;
    local_fd8 = fVar62;
    fStack_fd4 = fVar62;
    fStack_fd0 = fVar62;
    fStack_fcc = fVar62;
    local_fe8 = fVar63;
    fStack_fe4 = fVar63;
    fStack_fe0 = fVar63;
    fStack_fdc = fVar63;
    fVar34 = fVar37;
    fVar35 = fVar37;
    fVar36 = fVar37;
    fVar55 = fVar54;
    fVar56 = fVar54;
    fVar57 = fVar54;
    fVar59 = fVar58;
    fVar60 = fVar58;
    fVar61 = fVar58;
    fVar64 = fVar65;
    fVar66 = fVar65;
    fVar67 = fVar65;
    fVar69 = fVar68;
    fVar70 = fVar68;
    fVar71 = fVar68;
    fVar73 = fVar72;
    fVar74 = fVar72;
    fVar75 = fVar72;
    fVar76 = fVar62;
    fVar77 = fVar62;
    fVar78 = fVar62;
    fVar79 = fVar63;
    fVar80 = fVar63;
    fVar81 = fVar63;
LAB_006a8bd0:
    if (local_ff8 != (undefined1 (*) [16])&local_f78) {
      pauVar16 = local_ff8 + -1;
      local_ff8 = local_ff8 + -1;
      if (*(float *)((long)*pauVar16 + 8) <= auVar40._0_4_) {
        uVar21 = *(ulong *)*local_ff8;
        while ((uVar21 & 8) == 0) {
          fVar13 = *(float *)((long)&(This->collider).name + 4);
          uVar14 = *(undefined4 *)&(This->intersector1).intersect;
          uVar15 = *(undefined4 *)&(This->intersector1).occluded;
          uVar17 = uVar21 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar17 + 0x80 + uVar20);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar20);
          auVar50._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar68) * fVar62;
          auVar50._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar69) * fVar76;
          auVar50._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar70) * fVar77;
          auVar50._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar71) * fVar78;
          auVar42._4_4_ = fVar59;
          auVar42._0_4_ = fVar58;
          auVar42._8_4_ = fVar60;
          auVar42._12_4_ = fVar61;
          auVar40 = maxps(auVar42,auVar50);
          pfVar2 = (float *)(uVar17 + 0x80 + uVar22);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar22);
          auVar53._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar72) * fVar63;
          auVar53._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar73) * fVar79;
          auVar53._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar74) * fVar80;
          auVar53._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar75) * fVar81;
          pfVar2 = (float *)(uVar17 + 0x80 + uVar23);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar23);
          auVar46._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar54) * fVar65;
          auVar46._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar55) * fVar64;
          auVar46._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar56) * fVar66;
          auVar46._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar57) * fVar67;
          auVar25 = maxps(auVar53,auVar46);
          local_1028 = maxps(auVar40,auVar25);
          pfVar2 = (float *)(uVar17 + 0x80 + uVar19);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar19);
          auVar47._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar68) * fVar62;
          auVar47._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar69) * fVar76;
          auVar47._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar70) * fVar77;
          auVar47._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar71) * fVar78;
          auVar43._4_4_ = fVar34;
          auVar43._0_4_ = fVar37;
          auVar43._8_4_ = fVar35;
          auVar43._12_4_ = fVar36;
          auVar40 = minps(auVar43,auVar47);
          pfVar2 = (float *)(uVar17 + 0x80 + (uVar22 ^ 0x10));
          pfVar1 = (float *)(uVar17 + 0x20 + (uVar22 ^ 0x10));
          auVar48._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar72) * fVar63;
          auVar48._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar73) * fVar79;
          auVar48._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar74) * fVar80;
          auVar48._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar75) * fVar81;
          pfVar2 = (float *)(uVar17 + 0x80 + (uVar23 ^ 0x10));
          pfVar1 = (float *)(uVar17 + 0x20 + (uVar23 ^ 0x10));
          auVar51._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar54) * fVar65;
          auVar51._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar55) * fVar64;
          auVar51._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar56) * fVar66;
          auVar51._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar57) * fVar67;
          auVar25 = minps(auVar48,auVar51);
          auVar40 = minps(auVar40,auVar25);
          if (((uint)uVar21 & 7) == 6) {
            bVar24 = (fVar13 < *(float *)(uVar17 + 0xf0) && *(float *)(uVar17 + 0xe0) <= fVar13) &&
                     local_1028._0_4_ <= auVar40._0_4_;
            bVar10 = (fVar13 < *(float *)(uVar17 + 0xf4) && *(float *)(uVar17 + 0xe4) <= fVar13) &&
                     local_1028._4_4_ <= auVar40._4_4_;
            bVar11 = (fVar13 < *(float *)(uVar17 + 0xf8) && *(float *)(uVar17 + 0xe8) <= fVar13) &&
                     local_1028._8_4_ <= auVar40._8_4_;
            bVar12 = (fVar13 < *(float *)(uVar17 + 0xfc) && *(float *)(uVar17 + 0xec) <= fVar13) &&
                     local_1028._12_4_ <= auVar40._12_4_;
          }
          else {
            bVar24 = local_1028._0_4_ <= auVar40._0_4_;
            bVar10 = local_1028._4_4_ <= auVar40._4_4_;
            bVar11 = local_1028._8_4_ <= auVar40._8_4_;
            bVar12 = local_1028._12_4_ <= auVar40._12_4_;
          }
          auVar38._0_4_ = (uint)bVar24 * -0x80000000;
          auVar38._4_4_ = (uint)bVar10 * -0x80000000;
          auVar38._8_4_ = (uint)bVar11 * -0x80000000;
          auVar38._12_4_ = (uint)bVar12 * -0x80000000;
          uVar18 = movmskps((int)context,auVar38);
          context = (RayQueryContext *)(ulong)uVar18;
          if (uVar18 == 0) {
            auVar40._4_4_ = uVar14;
            auVar40._0_4_ = uVar14;
            auVar40._8_4_ = uVar15;
            auVar40._12_4_ = uVar15;
            goto LAB_006a8bd0;
          }
          context = (RayQueryContext *)0x0;
          if ((byte)uVar18 != 0) {
            for (; ((byte)uVar18 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar21 = *(ulong *)(uVar17 + (long)context * 8);
          uVar18 = (uVar18 & 0xff) - 1 & uVar18 & 0xff;
          if (uVar18 != 0) {
            uVar4 = *(uint *)(local_1028 + (long)context * 4);
            lVar9 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar7 = *(ulong *)(uVar17 + lVar9 * 8);
            uVar5 = *(uint *)(local_1028 + lVar9 * 4);
            uVar18 = uVar18 - 1 & uVar18;
            context = (RayQueryContext *)(ulong)uVar18;
            if (uVar18 == 0) {
              if (uVar4 < uVar5) {
                *(ulong *)*local_ff8 = uVar7;
                *(uint *)((long)*local_ff8 + 8) = uVar5;
                local_ff8 = local_ff8 + 1;
              }
              else {
                *(ulong *)*local_ff8 = uVar21;
                *(uint *)((long)*local_ff8 + 8) = uVar4;
                local_ff8 = local_ff8 + 1;
                uVar21 = uVar7;
              }
            }
            else {
              auVar39._8_4_ = uVar4;
              auVar39._0_8_ = uVar21;
              auVar39._12_4_ = 0;
              auVar44._8_4_ = uVar5;
              auVar44._0_8_ = uVar7;
              auVar44._12_4_ = 0;
              lVar9 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar18 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                }
              }
              uVar8 = *(undefined8 *)(uVar17 + lVar9 * 8);
              iVar6 = *(int *)(local_1028 + lVar9 * 4);
              auVar41._8_4_ = iVar6;
              auVar41._0_8_ = uVar8;
              auVar41._12_4_ = 0;
              auVar26._8_4_ = -(uint)((int)uVar4 < (int)uVar5);
              uVar18 = uVar18 - 1 & uVar18;
              if (uVar18 == 0) {
                auVar26._4_4_ = auVar26._8_4_;
                auVar26._0_4_ = auVar26._8_4_;
                auVar26._12_4_ = auVar26._8_4_;
                auVar49._8_4_ = uVar5;
                auVar49._0_8_ = uVar7;
                auVar49._12_4_ = 0;
                auVar25 = blendvps(auVar49,auVar39,auVar26);
                auVar40 = blendvps(auVar39,auVar44,auVar26);
                auVar27._8_4_ = -(uint)(auVar25._8_4_ < iVar6);
                auVar27._4_4_ = auVar27._8_4_;
                auVar27._0_4_ = auVar27._8_4_;
                auVar27._12_4_ = auVar27._8_4_;
                auVar45._8_4_ = iVar6;
                auVar45._0_8_ = uVar8;
                auVar45._12_4_ = 0;
                auVar42 = blendvps(auVar45,auVar25,auVar27);
                auVar50 = blendvps(auVar25,auVar41,auVar27);
                auVar28._8_4_ = -(uint)(auVar40._8_4_ < auVar50._8_4_);
                auVar28._4_4_ = auVar28._8_4_;
                auVar28._0_4_ = auVar28._8_4_;
                auVar28._12_4_ = auVar28._8_4_;
                auVar25 = blendvps(auVar50,auVar40,auVar28);
                auVar40 = blendvps(auVar40,auVar50,auVar28);
                *local_ff8 = auVar40;
                local_ff8[1] = auVar25;
                uVar21 = auVar42._0_8_;
                local_ff8 = local_ff8 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                auVar29._4_4_ = auVar26._8_4_;
                auVar29._0_4_ = auVar26._8_4_;
                auVar29._8_4_ = auVar26._8_4_;
                auVar29._12_4_ = auVar26._8_4_;
                auVar50 = blendvps(auVar44,auVar39,auVar29);
                auVar40 = blendvps(auVar39,auVar44,auVar29);
                auVar52._8_4_ = *(int *)(local_1028 + (long)context * 4);
                auVar52._0_8_ = *(undefined8 *)(uVar17 + (long)context * 8);
                auVar52._12_4_ = 0;
                auVar30._8_4_ = -(uint)(iVar6 < *(int *)(local_1028 + (long)context * 4));
                auVar30._4_4_ = auVar30._8_4_;
                auVar30._0_4_ = auVar30._8_4_;
                auVar30._12_4_ = auVar30._8_4_;
                auVar42 = blendvps(auVar52,auVar41,auVar30);
                auVar25 = blendvps(auVar41,auVar52,auVar30);
                auVar31._8_4_ = -(uint)(auVar40._8_4_ < auVar25._8_4_);
                auVar31._4_4_ = auVar31._8_4_;
                auVar31._0_4_ = auVar31._8_4_;
                auVar31._12_4_ = auVar31._8_4_;
                auVar53 = blendvps(auVar25,auVar40,auVar31);
                auVar40 = blendvps(auVar40,auVar25,auVar31);
                auVar32._8_4_ = -(uint)(auVar50._8_4_ < auVar42._8_4_);
                auVar32._4_4_ = auVar32._8_4_;
                auVar32._0_4_ = auVar32._8_4_;
                auVar32._12_4_ = auVar32._8_4_;
                auVar25 = blendvps(auVar42,auVar50,auVar32);
                auVar50 = blendvps(auVar50,auVar42,auVar32);
                auVar33._8_4_ = -(uint)(auVar50._8_4_ < auVar53._8_4_);
                auVar33._4_4_ = auVar33._8_4_;
                auVar33._0_4_ = auVar33._8_4_;
                auVar33._12_4_ = auVar33._8_4_;
                auVar42 = blendvps(auVar53,auVar50,auVar33);
                auVar50 = blendvps(auVar50,auVar53,auVar33);
                *local_ff8 = auVar40;
                local_ff8[1] = auVar50;
                local_ff8[2] = auVar42;
                uVar21 = auVar25._0_8_;
                local_ff8 = local_ff8 + 3;
              }
            }
          }
        }
        local_ff0 = (ulong)((uint)uVar21 & 0xf) - 8;
        prim = (RayQueryContext *)(uVar21 & 0xfffffffffffffff0);
        while (bVar24 = local_ff0 != 0, local_ff0 = local_ff0 + -1, bVar24) {
          context = prim;
          InstanceIntersector1MB::intersect
                    (&local_1029,(RayHit *)This,(RayQueryContext *)local_1000,
                     (InstancePrimitive *)prim);
          prim = (RayQueryContext *)&prim->args;
          This = local_1008;
          uVar20 = local_1010;
          fVar54 = local_f88;
          fVar55 = fStack_f84;
          fVar56 = fStack_f80;
          fVar57 = fStack_f7c;
          fVar58 = local_f98;
          fVar59 = fStack_f94;
          fVar60 = fStack_f90;
          fVar61 = fStack_f8c;
          fVar65 = local_fa8;
          fVar64 = fStack_fa4;
          fVar66 = fStack_fa0;
          fVar67 = fStack_f9c;
          fVar68 = local_fb8;
          fVar69 = fStack_fb4;
          fVar70 = fStack_fb0;
          fVar71 = fStack_fac;
          fVar72 = local_fc8;
          fVar73 = fStack_fc4;
          fVar74 = fStack_fc0;
          fVar75 = fStack_fbc;
          fVar62 = local_fd8;
          fVar76 = fStack_fd4;
          fVar77 = fStack_fd0;
          fVar78 = fStack_fcc;
          fVar63 = local_fe8;
          fVar79 = fStack_fe4;
          fVar80 = fStack_fe0;
          fVar81 = fStack_fdc;
        }
        auVar40._0_8_ = (This->intersector1).intersect;
        auVar40._8_8_ = (This->intersector1).occluded;
        fVar37 = (float)auVar40._0_8_;
        fVar34 = fVar37;
        fVar35 = fVar37;
        fVar36 = fVar37;
      }
      goto LAB_006a8bd0;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }